

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotor.cpp
# Opt level: O2

void __thiscall chrono::ChShaftsMotor::ArchiveIN(ChShaftsMotor *this,ChArchiveIn *marchive)

{
  eCh_shaftsmotor_mode_mapper mmapper;
  ChEnumMapper<chrono::ChShaftsMotor::eCh_shaftsmotor_mode> local_c0;
  ChEnumMapper<chrono::ChShaftsMotor::eCh_shaftsmotor_mode> local_a0;
  ChNameValue<double> local_80;
  ChNameValue<double> local_68;
  ChNameValue<double> local_50;
  ChNameValue<chrono::ChEnumMapper<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_> local_38;
  
  ChArchiveIn::VersionRead<chrono::ChShaftsMotor>(marchive);
  ChShaftsMotorBase::ArchiveIN(&this->super_ChShaftsMotorBase,marchive);
  my_enum_mappers::eCh_shaftsmotor_mode_mapper::eCh_shaftsmotor_mode_mapper
            ((eCh_shaftsmotor_mode_mapper *)&local_a0);
  my_enum_mappers::eCh_shaftsmotor_mode_mapper::operator()
            (&local_c0,(eCh_shaftsmotor_mode_mapper *)&local_a0,&this->motor_mode);
  local_38._name = "motor_mode";
  local_38._flags = '\0';
  local_38._value = &local_c0;
  ChArchiveIn::operator>>(marchive,&local_38);
  ChEnumMapper<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>::~ChEnumMapper(&local_c0);
  local_50._value = &this->motor_torque;
  local_50._name = "motor_torque";
  local_50._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_50);
  local_68._value = &this->motor_set_rot;
  local_68._name = "motor_set_rot";
  local_68._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_68);
  local_80._value = &this->motor_set_rot_dt;
  local_80._name = "motor_set_rot_dt";
  local_80._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_80);
  ChEnumMapper<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>::~ChEnumMapper(&local_a0);
  return;
}

Assistant:

void ChShaftsMotor::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChShaftsMotor>();

    // deserialize parent class:
    ChShaftsMotorBase::ArchiveIN(marchive);

    // deserialize all member data:
    my_enum_mappers::eCh_shaftsmotor_mode_mapper mmapper;
    marchive >> CHNVP(mmapper(motor_mode), "motor_mode");
    marchive >> CHNVP(motor_torque);
    marchive >> CHNVP(motor_set_rot);
    marchive >> CHNVP(motor_set_rot_dt);
}